

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::RepeatedRemoveDirectory(string *dir)

{
  bool bVar1;
  Status local_18;
  string *local_10;
  string *dir_local;
  
  local_10 = dir;
  local_18 = cmsys::SystemTools::RemoveADirectory(dir);
  bVar1 = cmsys::Status::operator_cast_to_bool(&local_18);
  return bVar1;
}

Assistant:

bool cmSystemTools::RepeatedRemoveDirectory(const std::string& dir)
{
#ifdef _WIN32
  // Windows sometimes locks files temporarily so try a few times.
  WindowsFileRetry retry = cmSystemTools::GetWindowsFileRetry();

  for (unsigned int i = 0; i < retry.Count; ++i) {
    if (cmSystemTools::RemoveADirectory(dir)) {
      return true;
    }
    cmSystemTools::Delay(retry.Delay);
  }
  return false;
#else
  return static_cast<bool>(cmSystemTools::RemoveADirectory(dir));
#endif
}